

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

void __thiscall
aeron::archive::AeronArchive::stopRecording(AeronArchive *this,int64_t subscriptionId)

{
  anon_class_16_2_3c4d5813 local_48;
  function<bool_(long)> local_38;
  int64_t local_18;
  int64_t subscriptionId_local;
  AeronArchive *this_local;
  
  local_48.subscriptionId = &local_18;
  local_48.this = this;
  local_18 = subscriptionId;
  subscriptionId_local = (int64_t)this;
  std::function<bool(long)>::function<aeron::archive::AeronArchive::stopRecording(long)::__0,void>
            ((function<bool(long)> *)&local_38,&local_48);
  callAndPollForResponse(this,&local_38,"stop recording");
  std::function<bool_(long)>::~function(&local_38);
  return;
}

Assistant:

void AeronArchive::stopRecording(std::int64_t subscriptionId) {
    callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->stopRecording(subscriptionId, correlationId, controlSessionId_);
        },
        "stop recording");
}